

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setMinimumSize(QWidget *this,int minw,int minh)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar4;
  QWExtra *pQVar5;
  QGraphicsProxyWidget *pQVar6;
  int iVar7;
  bool bVar8;
  Representation RVar9;
  QWidgetPrivate *d;
  uint uVar10;
  long in_FS_OFFSET;
  int local_50;
  int local_4c;
  undefined1 local_48 [8];
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  local_50 = minh;
  local_4c = minw;
  bVar8 = QWidgetPrivate::setMinimumSize_helper(this_00,&local_4c,&local_50);
  if (bVar8) {
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      QWidgetPrivate::setConstraints_sys(this_00);
    }
    iVar7 = local_4c;
    pQVar4 = this->data;
    RVar9.m_i = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
    if ((RVar9.m_i < local_4c) || (((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1 < local_50)
       ) {
      uVar10 = *(uint *)(*(long *)&this->field_0x8 + 0x240) & 0x400;
      if (RVar9.m_i < local_4c) {
        RVar9.m_i = local_4c;
      }
      local_48._4_4_ = ((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i) + 1;
      if ((int)local_48._4_4_ < local_50) {
        local_48._4_4_ = local_50;
      }
      uVar2 = *(uint *)&pQVar4->field_0x10;
      local_48._0_4_ = RVar9.m_i;
      resize(this,(QSize *)local_48);
      uVar3 = *(uint *)(*(long *)&this->field_0x8 + 0x240);
      if ((byte)(uVar10 >> 10) != ((byte)(uVar3 >> 10) & 1)) {
        *(uint *)(*(long *)&this->field_0x8 + 0x240) = uVar3 & 0xfffffbff | uVar10;
      }
      if ((uVar2 & 2) != 0) {
        puVar1 = &this->data->field_0x10;
        *(uint *)puVar1 = *(uint *)puVar1 | 2;
      }
    }
    pQVar5 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar5 != (QWExtra *)0x0) &&
       (pQVar6 = pQVar5->proxyWidget, pQVar6 != (QGraphicsProxyWidget *)0x0)) {
      local_48 = (undefined1  [8])(double)iVar7;
      local_40 = (double)local_50;
      QGraphicsLayoutItem::setMinimumSize
                (&(pQVar6->super_QGraphicsWidget).super_QGraphicsLayoutItem,(QSizeF *)local_48);
    }
    pQVar5 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if (pQVar5->minw == pQVar5->maxw) {
      bVar8 = pQVar5->minh == pQVar5->maxh;
    }
    else {
      bVar8 = false;
    }
    QWidgetPrivate::updateGeometry_helper(this_00,bVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setMinimumSize(int minw, int minh)
{
    Q_D(QWidget);
    if (!d->setMinimumSize_helper(minw, minh))
        return;

    if (isWindow())
        d->setConstraints_sys();
    if (minw > width() || minh > height()) {
        bool resized = testAttribute(Qt::WA_Resized);
        bool maximized = isMaximized();
        resize(qMax(minw,width()), qMax(minh,height()));
        setAttribute(Qt::WA_Resized, resized); //not a user resize
        if (maximized)
            data->window_state = data->window_state | Qt::WindowMaximized;
    }
#if QT_CONFIG(graphicsview)
    if (d->extra) {
        if (d->extra->proxyWidget)
            d->extra->proxyWidget->setMinimumSize(minw, minh);
    }
#endif
    d->updateGeometry_helper(d->extra->minw == d->extra->maxw && d->extra->minh == d->extra->maxh);
}